

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Bit_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Gia_Man_t *pGVar10;
  bool bVar11;
  int fCompl1;
  int fCompl0;
  int iBit;
  int iBitOld;
  int k;
  int i;
  int f;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Bit_t *vInitEnd;
  int iFrEnd_local;
  int iFrBeg_local;
  Vec_Bit_t **pvInits_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  fCompl1 = 0;
  Gia_ManCleanMark0(p);
  iBit = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar11 = false;
    if (iBit < iVar3) {
      iVar3 = Gia_ManPiNum(p);
      pObjRo = Gia_ManCi(p,iVar3 + iBit);
      bVar11 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    iBit = iBit + 1;
    fCompl1 = fCompl1 + 1;
  }
  iVar3 = Gia_ManRegNum(p);
  pVVar7 = Vec_BitStart(iVar3);
  *pvInits = pVVar7;
  for (iBitOld = 0; iVar3 = fCompl1, iBitOld < iFrEnd; iBitOld = iBitOld + 1) {
    if (iBitOld == iFrBeg) {
      iBit = 0;
      while( true ) {
        iVar3 = Gia_ManRegNum(p);
        bVar11 = false;
        if (iBit < iVar3) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + iBit);
          bVar11 = pObjRi != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        if ((*(ulong *)pObjRi >> 0x1e & 1) != 0) {
          Vec_BitWriteEntry(*pvInits,iBit,1);
        }
        iBit = iBit + 1;
      }
    }
    iBit = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar11 = false;
      if (iBit < iVar3) {
        pObjRo = Gia_ManCi(p,iBit);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      iBit = iBit + 1;
      fCompl1 = fCompl1 + 1;
    }
    iBit = 0;
    while( true ) {
      bVar11 = false;
      if (iBit < p->nObjs) {
        pObjRo = Gia_ManObj(p,iBit);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar8 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar8;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        pGVar8 = Gia_ObjFanin1(pObjRo);
        uVar1 = *(ulong *)pGVar8;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      iBit = iBit + 1;
    }
    iBit = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar11 = false;
      if (iBit < iVar3) {
        pObjRo = Gia_ManCo(p,iBit);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      pGVar8 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar8;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      iBit = iBit + 1;
    }
    iBit = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar11 = false;
      if (iBit < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _i = Gia_ManCo(p,iVar3 + iBit);
        bVar11 = false;
        if (_i != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + iBit);
          bVar11 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar11) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff | (ulong)((uint)(*(ulong *)_i >> 0x1e) & 1) << 0x1e
      ;
      iBit = iBit + 1;
    }
  }
  if (iBitOld != iFrEnd) {
    __assert_fail("i == iFrEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                  ,0x10b,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  iVar6 = Gia_ManRegNum(p);
  pVVar7 = Vec_BitStart(iVar6);
  iBit = 0;
  while( true ) {
    iVar6 = Gia_ManRegNum(p);
    bVar11 = false;
    if (iBit < iVar6) {
      iVar6 = Gia_ManPiNum(p);
      pObjRi = Gia_ManCi(p,iVar6 + iBit);
      bVar11 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    if ((*(ulong *)pObjRi >> 0x1e & 1) != 0) {
      Vec_BitWriteEntry(pVVar7,iBit,1);
    }
    iBit = iBit + 1;
  }
  p_00 = Gia_ManStart(10000);
  pcVar9 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar9;
  iBit = 0;
  while( true ) {
    iVar6 = Gia_ManRegNum(p);
    bVar11 = false;
    if (iBit < iVar6) {
      iVar6 = Gia_ManPiNum(p);
      pObjRi = Gia_ManCi(p,iVar6 + iBit);
      bVar11 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    Gia_ManAppendCi(p_00);
    iBit = iBit + 1;
  }
  Gia_ManHashStart(p_00);
  pGVar8 = Gia_ManConst0(p);
  pGVar8->Value = 1;
  iBit = 0;
  while( true ) {
    iVar6 = Gia_ManPiNum(p);
    bVar11 = false;
    if (iBit < iVar6) {
      pObjRo = Gia_ManCi(p,iBit);
      bVar11 = pObjRo != (Gia_Obj_t *)0x0;
    }
    k = iFrEnd;
    if (!bVar11) break;
    pObjRo->Value = 1;
    iBit = iBit + 1;
  }
  do {
    if (pCex->iFrame < k) {
      Gia_ManHashStop(p_00);
      Vec_BitFree(pVVar7);
      pGVar10 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar10;
    }
    iBit = 0;
    while( true ) {
      iVar6 = Gia_ManRegNum(p);
      bVar11 = false;
      if (iBit < iVar6) {
        iVar6 = Gia_ManPiNum(p);
        pObjRi = Gia_ManCi(p,iVar6 + iBit);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      fCompl1 = iVar3;
      iBitOld = iFrEnd;
      if (!bVar11) break;
      uVar5 = Vec_BitEntry(pVVar7,iBit);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      iBit = iBit + 1;
    }
    for (; iBitOld < k; iBitOld = iBitOld + 1) {
      iBit = 0;
      while( true ) {
        iVar6 = Gia_ManPiNum(p);
        bVar11 = false;
        if (iBit < iVar6) {
          pObjRo = Gia_ManCi(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
        *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
        iBit = iBit + 1;
        fCompl1 = fCompl1 + 1;
      }
      iBit = 0;
      while( true ) {
        bVar11 = false;
        if (iBit < p->nObjs) {
          pObjRo = Gia_ManObj(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        iVar6 = Gia_ObjIsAnd(pObjRo);
        if (iVar6 != 0) {
          pGVar8 = Gia_ObjFanin0(pObjRo);
          uVar2 = *(ulong *)pGVar8;
          uVar5 = Gia_ObjFaninC0(pObjRo);
          pGVar8 = Gia_ObjFanin1(pObjRo);
          uVar1 = *(ulong *)pGVar8;
          uVar4 = Gia_ObjFaninC1(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xffffffffbfffffff |
               ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) &
               1) << 0x1e;
        }
        iBit = iBit + 1;
      }
      iBit = 0;
      while( true ) {
        iVar6 = Vec_IntSize(p->vCos);
        bVar11 = false;
        if (iBit < iVar6) {
          pObjRo = Gia_ManCo(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        pGVar8 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar8;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff |
             ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
        iBit = iBit + 1;
      }
      iBit = 0;
      while( true ) {
        iVar6 = Gia_ManRegNum(p);
        bVar11 = false;
        if (iBit < iVar6) {
          iVar6 = Gia_ManPoNum(p);
          _i = Gia_ManCo(p,iVar6 + iBit);
          bVar11 = false;
          if (_i != (Gia_Obj_t *)0x0) {
            iVar6 = Gia_ManPiNum(p);
            pObjRi = Gia_ManCi(p,iVar6 + iBit);
            bVar11 = pObjRi != (Gia_Obj_t *)0x0;
          }
        }
        if (!bVar11) break;
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             (ulong)((uint)(*(ulong *)_i >> 0x1e) & 1) << 0x1e;
        iBit = iBit + 1;
      }
    }
    iBit = 0;
    while( true ) {
      iVar6 = Gia_ManRegNum(p);
      bVar11 = false;
      if (iBit < iVar6) {
        iVar6 = Gia_ManPiNum(p);
        pObjRi = Gia_ManCi(p,iVar6 + iBit);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      pGVar8 = Gia_ManPi(p_00,iBit);
      iVar6 = Gia_Obj2Lit(p_00,pGVar8);
      uVar5 = Abc_LitNotCond(iVar6,(uint)(((*(ulong *)pObjRi >> 0x1e & 1) != 0 ^ 0xffU) & 1));
      pObjRi->Value = uVar5;
      iBit = iBit + 1;
    }
    for (iBitOld = k; iBitOld <= pCex->iFrame; iBitOld = iBitOld + 1) {
      iBit = 0;
      while( true ) {
        iVar6 = Gia_ManPiNum(p);
        bVar11 = false;
        if (iBit < iVar6) {
          pObjRo = Gia_ManCi(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
        *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
        iBit = iBit + 1;
        fCompl1 = fCompl1 + 1;
      }
      iBit = 0;
      while( true ) {
        bVar11 = false;
        if (iBit < p->nObjs) {
          pObjRo = Gia_ManObj(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        iVar6 = Gia_ObjIsAnd(pObjRo);
        if (iVar6 != 0) {
          pGVar8 = Gia_ObjFanin0(pObjRo);
          uVar2 = *(ulong *)pGVar8;
          uVar5 = Gia_ObjFaninC0(pObjRo);
          uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
          pGVar8 = Gia_ObjFanin1(pObjRo);
          uVar2 = *(ulong *)pGVar8;
          uVar4 = Gia_ObjFaninC1(pObjRo);
          uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)(uVar5 & uVar4) & 1) << 0x1e;
          if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
            if ((uVar5 == 0) && (uVar4 == 0)) {
              pGVar8 = Gia_ObjFanin0(pObjRo);
              uVar5 = pGVar8->Value;
              pGVar8 = Gia_ObjFanin1(pObjRo);
              uVar5 = Gia_ManHashOr(p_00,uVar5,pGVar8->Value);
              pObjRo->Value = uVar5;
            }
            else if (uVar5 == 0) {
              pGVar8 = Gia_ObjFanin0(pObjRo);
              pObjRo->Value = pGVar8->Value;
            }
            else {
              if (uVar4 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                              ,0x144,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              pGVar8 = Gia_ObjFanin1(pObjRo);
              pObjRo->Value = pGVar8->Value;
            }
          }
          else {
            pGVar8 = Gia_ObjFanin0(pObjRo);
            uVar5 = pGVar8->Value;
            pGVar8 = Gia_ObjFanin1(pObjRo);
            uVar5 = Gia_ManHashAnd(p_00,uVar5,pGVar8->Value);
            pObjRo->Value = uVar5;
          }
          if (pObjRo->Value == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                          ,0x145,
                          "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                         );
          }
        }
        iBit = iBit + 1;
      }
      iBit = 0;
      while( true ) {
        iVar6 = Vec_IntSize(p->vCos);
        bVar11 = false;
        if (iBit < iVar6) {
          pObjRo = Gia_ManCo(p,iBit);
          bVar11 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        pGVar8 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar8;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff |
             ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
        pGVar8 = Gia_ObjFanin0(pObjRo);
        pObjRo->Value = pGVar8->Value;
        if (pObjRo->Value == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                        ,0x14b,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
        iBit = iBit + 1;
      }
      if (iBitOld == pCex->iFrame) break;
      iBit = 0;
      while( true ) {
        iVar6 = Gia_ManRegNum(p);
        bVar11 = false;
        if (iBit < iVar6) {
          iVar6 = Gia_ManPoNum(p);
          _i = Gia_ManCo(p,iVar6 + iBit);
          bVar11 = false;
          if (_i != (Gia_Obj_t *)0x0) {
            iVar6 = Gia_ManPiNum(p);
            pObjRi = Gia_ManCi(p,iVar6 + iBit);
            bVar11 = pObjRi != (Gia_Obj_t *)0x0;
          }
        }
        if (!bVar11) break;
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             (ulong)((uint)(*(ulong *)_i >> 0x1e) & 1) << 0x1e;
        pObjRi->Value = _i->Value;
        iBit = iBit + 1;
      }
    }
    if (fCompl1 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                    ,0x155,
                    "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                   );
    }
    pGVar8 = Gia_ManPo(p,pCex->iPo);
    Gia_ManAppendCo(p_00,pGVar8->Value);
    k = k + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}